

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

QString * __thiscall
ProjectBuilderMakefileGenerator::findProgram
          (QString *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,ProString *prog)

{
  QString file;
  int *piVar1;
  QArrayData *pQVar2;
  char cVar3;
  undefined1 *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  undefined1 local_b0 [28];
  DependencyMode DStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ProString *local_88;
  QArrayDataPointer<QString> local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_const_char_(&)[2]>,_const_ProString_&> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ProString::toQString(__return_storage_ptr__,prog);
  cVar3 = QDir::isRelativePath((QString *)__return_storage_ptr__);
  if (cVar3 != '\0') {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    qgetenv(local_b0);
    QVar6.m_data = (storage_type *)local_b0._16_8_;
    QVar6.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar6);
    local_b0._24_4_ = (int)local_58.a.a;
    DStack_94 = local_58.a.a._4_4_;
    uStack_90 = local_58.a.b._0_4_;
    uStack_8c = local_58.a.b._4_4_;
    local_88 = local_58.b;
    QString::split(&local_78,local_b0 + 0x18,0x3a,0,1);
    piVar1 = (int *)CONCAT44(DStack_94,local_b0._24_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(DStack_94,local_b0._24_4_),2,0x10);
      }
    }
    if ((QArrayData *)local_b0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b0._0_8_,1,0x10);
      }
    }
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      lVar5 = 0;
      puVar4 = (undefined1 *)0x0;
      do {
        local_88 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        local_b0._24_4_ = -0x55555556;
        DStack_94 = 0xaaaaaaaa;
        uStack_90 = 0xaaaaaaaa;
        uStack_8c = 0xaaaaaaaa;
        local_58.a.a = (QString *)((long)&((local_78.ptr)->d).d + lVar5);
        local_58.a.b = (char (*) [2])0x2aaddb;
        local_58.b = prog;
        QStringBuilder<QStringBuilder<const_QString_&,_const_char_(&)[2]>,_const_ProString_&>::
        convertTo<QString>((QString *)(local_b0 + 0x18),&local_58);
        pQVar2 = (QArrayData *)CONCAT44(DStack_94,local_b0._24_4_);
        local_58.a.b = (char (*) [2])CONCAT44(uStack_8c,uStack_90);
        if (pQVar2 == (QArrayData *)0x0) {
          local_58.a.a = (QString *)0x0;
        }
        else {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          local_58.a.a = (QString *)pQVar2;
        }
        local_58.b = local_88;
        file.d.ptr = (char16_t *)this;
        file.d.d = (Data *)__return_storage_ptr__;
        file.d.size = (qsizetype)prog;
        MakefileGenerator::fileInfo((MakefileGenerator *)local_b0,file);
        cVar3 = QFileInfo::exists();
        QFileInfo::~QFileInfo((QFileInfo *)local_b0);
        if ((QArrayData *)local_58.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_58.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_58.a.a,2,0x10);
          }
        }
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        if (cVar3 != '\0') {
          QString::operator=(__return_storage_ptr__,(QString *)(local_b0 + 0x18));
          piVar1 = (int *)CONCAT44(DStack_94,local_b0._24_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(DStack_94,local_b0._24_4_),2,0x10);
            }
          }
          break;
        }
        piVar1 = (int *)CONCAT44(DStack_94,local_b0._24_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(DStack_94,local_b0._24_4_),2,0x10);
          }
        }
        puVar4 = puVar4 + 1;
        lVar5 = lVar5 + 0x18;
      } while (puVar4 < (ulong)local_78.size);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString
ProjectBuilderMakefileGenerator::findProgram(const ProString &prog)
{
    QString ret = prog.toQString();
    if(QDir::isRelativePath(ret)) {
        QStringList paths = QString(qgetenv("PATH")).split(':');
        for(int i = 0; i < paths.size(); ++i) {
            QString path = paths.at(i) + "/" + prog;
            if(exists(path)) {
                ret = path;
                break;
            }
        }
    }
    return ret;
}